

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O3

char * x_monnam(monst *mtmp,int article,char *adjective,int suppress,boolean called)

{
  permonst *pm;
  permonst *ppVar1;
  char cVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  obj *poVar7;
  monst *mon;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  bool bVar15;
  char priestnambuf [256];
  char local_138 [4];
  undefined2 local_134;
  
  uVar6 = suppress | 4;
  if (program_state.gameover == 0) {
    uVar6 = suppress;
  }
  if (article == 3) {
    article = (uint)(mtmp->mtame != '\0') * 2 + 1;
  }
  pm = mtmp->data;
  bVar15 = false;
  if ((u.uprops[0x23].intrinsic != 0) && (bVar15 = false, u.uprops[0x24].extrinsic == 0)) {
    if ((u.umonnum == u.umonster) || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')) {
      bVar15 = (uVar6 & 4) == 0;
    }
    else {
      bVar15 = false;
    }
  }
  uVar4 = *(uint *)&mtmp->field_0x60;
  uVar14 = uVar4 & 2;
  if (mtmp->wormno == '\0') {
    uVar12 = uVar14;
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0017d42b;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017d41d;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017d418;
    }
    else {
LAB_0017d418:
      if (ublindf == (obj *)0x0) goto LAB_0017d473;
LAB_0017d41d:
      if (ublindf->oartifact != '\x1d') goto LAB_0017d473;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_0017d42b;
LAB_0017d473:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar7 = which_armor(mtmp,4), poVar7 == (obj *)0x0 ||
        (poVar7 = which_armor(mtmp,4), poVar7->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017d4c3;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017d4be;
      }
      else {
LAB_0017d4be:
        if (ublindf != (obj *)0x0) {
LAB_0017d4c3:
          if (ublindf->oartifact == '\x1d') goto LAB_0017d54f;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0017d59a;
      }
LAB_0017d54f:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41))))
      goto LAB_0017d59a;
    }
    if (((u.uprops[0x42].intrinsic == 0) &&
        (((u.uprops[0x42].extrinsic == 0 && (bVar3 = match_warn_of_mon(mtmp), article != 3)) &&
         (bVar3 == '\0')))) &&
       ((((program_state.gameover == 0 && (u.usteed != mtmp)) &&
         (((u._1052_1_ & 1) == 0 || (u.ustuck != mtmp)))) && ((uVar6 & 1) == 0)))) {
      x_monnam::buf._2_2_ = SUB42(x_monnam::buf._0_4_,2) & 0xff00;
      x_monnam::buf[0] = 'i';
      x_monnam::buf[1] = 't';
      return x_monnam::buf;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 == '\0') goto LAB_0017d473;
    uVar4 = *(uint *)&mtmp->field_0x60;
    uVar12 = uVar4 & 2;
LAB_0017d42b:
    if (((uVar12 != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0017d466;
      goto LAB_0017d473;
    }
    if ((uVar4 & 0x280) != 0) goto LAB_0017d473;
LAB_0017d466:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_0017d473;
  }
LAB_0017d59a:
  x_monnam::buf._0_4_ = x_monnam::buf._0_4_ & 0xffffff00;
  bVar13 = (uVar6 & 2) == 0 & (byte)(uVar14 >> 1);
  if ((*(uint *)&mtmp->field_0x60 & 0x14000000) != 0) {
    mon = newmonst((uint)mtmp->mxtyp,(uint)mtmp->mnamelth);
    uVar6 = u.uprops[0x24].extrinsic;
    memcpy(mon,mtmp,(long)mtmp->mxlth + (ulong)mtmp->mnamelth + 0x78);
    if (!bVar15) {
      u.uprops[0x24].extrinsic = 1;
    }
    if (bVar13 == 0) {
      mon->field_0x60 = mon->field_0x60 & 0xfd;
    }
    pcVar8 = priestname(mon,local_138);
    u.uprops[0x24].extrinsic = uVar6;
    if (article == 0) {
      iVar5 = strncmp(pcVar8,"the ",4);
      pcVar8 = pcVar8 + (ulong)(iVar5 == 0) * 4;
    }
    strcpy(x_monnam::buf,pcVar8);
    free(mon);
    return x_monnam::buf;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) != 0 && !bVar15) {
    if ((adjective == (char *)0x0) || (article != 1)) {
      pcVar8 = shkname(mtmp);
      strcat(x_monnam::buf,pcVar8);
      if (pm == mons + 0x11a && bVar13 == 0) {
        return x_monnam::buf;
      }
      sVar9 = strlen(x_monnam::buf);
      builtin_strncpy(x_monnam::buf + sVar9," the",4);
      (x_monnam::buf + sVar9 + 4)[0] = ' ';
      (x_monnam::buf + sVar9 + 4)[1] = '\0';
      if (bVar13 != 0) {
        sVar9 = strlen(x_monnam::buf);
        builtin_strncpy(x_monnam::buf + sVar9,"invisibl",8);
        builtin_strncpy(x_monnam::buf + sVar9 + 7,"le ",4);
      }
      pcVar8 = mons_mname(pm);
    }
    else {
      builtin_strncpy(x_monnam::buf,"the ",5);
      strcat(x_monnam::buf,adjective);
      sVar9 = strlen(x_monnam::buf);
      (x_monnam::buf + sVar9)[0] = ' ';
      (x_monnam::buf + sVar9)[1] = '\0';
      pcVar8 = shkname(mtmp);
    }
    pcVar8 = strcat(x_monnam::buf,pcVar8);
    return pcVar8;
  }
  if (adjective != (char *)0x0) {
    strcat(x_monnam::buf,adjective);
    sVar9 = strlen(x_monnam::buf);
    (x_monnam::buf + sVar9)[0] = ' ';
    (x_monnam::buf + sVar9)[1] = '\0';
  }
  if (bVar13 != 0) {
    sVar9 = strlen(x_monnam::buf);
    builtin_strncpy(x_monnam::buf + sVar9,"invisibl",8);
    builtin_strncpy(x_monnam::buf + sVar9 + 7,"le ",4);
  }
  if (((uVar6 & 8) == 0) && ((mtmp->misc_worn_check & 0x100000) != 0)) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017d700;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017d6f7;
LAB_0017d91c:
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
        sVar9 = strlen(x_monnam::buf);
        builtin_strncpy(x_monnam::buf + sVar9,"saddled ",8);
        x_monnam::buf[sVar9 + 8] = '\0';
      }
    }
    else {
LAB_0017d6f7:
      if (ublindf != (obj *)0x0) {
LAB_0017d700:
        if (ublindf->oartifact == '\x1d') goto LAB_0017d91c;
      }
    }
  }
  if (bVar15) {
    pcVar8 = rndmonnam();
    strcat(x_monnam::buf,pcVar8);
LAB_0017d99b:
    if (((article != 2) || ((pm->geno & 0x1000) == 0)) && (article != 1)) {
      if (article == 2) {
        pcVar8 = an(x_monnam::buf);
        return pcVar8;
      }
      if (article != 3) {
LAB_0017de0c:
        return x_monnam::buf;
      }
      local_134 = 0x20;
      builtin_strncpy(local_138,"your",4);
      goto LAB_0017d9c3;
    }
  }
  else {
    cVar2 = x_monnam::buf[0];
    if (mtmp->mnamelth == '\0') {
      if ((pm < (permonst *)((long)&mons[0x168].mname + 1) && &mons[0x158].field_0x3f < pm) &&
         (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
        bVar13 = mtmp->m_lev;
        iVar5 = monsndx(pm);
        pcVar8 = rank_of((uint)bVar13,(short)iVar5,(byte)*(undefined4 *)&mtmp->field_0x60 & 1);
        strcpy(local_138,pcVar8);
        pcVar8 = lcase(local_138);
        strcat(x_monnam::buf,pcVar8);
        goto LAB_0017d99b;
      }
      ppVar1 = mtmp->data;
      if ((ppVar1 != mons + 0x145 && (ppVar1 != mons + 0x146 && ppVar1 != mons + 0x144)) ||
         (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 3)) {
LAB_0017ddb5:
        pcVar8 = mons_mname(pm);
        strcat(x_monnam::buf,pcVar8);
        goto LAB_0017ddd1;
      }
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0017dd5c;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0017dcf5;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017dcec;
        }
        else {
LAB_0017dcec:
          if (ublindf == (obj *)0x0) goto LAB_0017de1f;
LAB_0017dcf5:
          if (ublindf->oartifact != '\x1d') goto LAB_0017de1f;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
        goto LAB_0017dd5c;
LAB_0017de1f:
        if ((uVar6 & 1) != 0) goto LAB_0017ddb5;
      }
      else {
        bVar3 = worm_known(level,mtmp);
        if (bVar3 == '\0') goto LAB_0017de1f;
LAB_0017dd5c:
        uVar4 = *(uint *)&mtmp->field_0x60;
        if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar4 & 0x280) != 0) goto LAB_0017de1f;
        }
        else if (((uVar4 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
        goto LAB_0017de1f;
        if (((byte)u._1052_1_ >> 5 & (uVar6 & 1) == 0) == 0) goto LAB_0017ddb5;
      }
      sVar9 = strlen(x_monnam::buf);
      builtin_strncpy(x_monnam::buf + sVar9,"Ride",4);
      (x_monnam::buf + sVar9 + 4)[0] = 'r';
      (x_monnam::buf + sVar9 + 4)[1] = '\0';
      goto LAB_0017d99b;
    }
    pcVar8 = (char *)((long)(mtmp->mtrack + 0x18) + (long)mtmp->mxlth);
    if (pm == mons + 0x12a) {
      bVar15 = x_monnam::buf[0] == '\0';
      pcVar10 = eos(x_monnam::buf);
      pcVar8 = s_suffix(pcVar8);
      sprintf(pcVar10,"%s ghost",pcVar8);
      if (article == 3 || bVar15) goto LAB_0017de0c;
      goto LAB_0017d99b;
    }
    if (called == '\0') {
      if ((mons + 0x168 < pm || pm < mons + 0x159) ||
         (pcVar10 = strstri(pcVar8," the "), pcVar10 == (char *)0x0)) {
        strcat(x_monnam::buf,pcVar8);
      }
      else {
        strcpy(local_138,pcVar8);
        local_138[(long)(pcVar10 + (5 - (long)pcVar8))] = '\0';
        if (cVar2 != '\0') {
          strcat(local_138,x_monnam::buf);
        }
        strcat(local_138,pcVar10 + 5);
        strcpy(x_monnam::buf,local_138);
        article = 0;
      }
      uVar6 = 1;
    }
    else {
      pcVar10 = eos(x_monnam::buf);
      pcVar11 = mons_mname(pm);
      sprintf(pcVar10,"%s called %s",pcVar11,pcVar8);
LAB_0017ddd1:
      uVar6 = pm->mflags2 >> 0x13 & 1;
    }
    if ((uVar6 == 0) || (cVar2 != '\0' && article != 3)) goto LAB_0017d99b;
    if (pm != mons + 0x128) goto LAB_0017de0c;
  }
  local_134 = (ushort)local_134._1_1_ << 8;
  builtin_strncpy(local_138,"the ",4);
LAB_0017d9c3:
  strcat(local_138,x_monnam::buf);
  strcpy(x_monnam::buf,local_138);
  return x_monnam::buf;
}

Assistant:

char *x_monnam(const struct monst *mtmp,
	       int article, /* ARTICLE_NONE, ARTICLE_THE, ARTICLE_A: obvious
	                     * ARTICLE_YOUR: "your" on pets, "the" on everything
			     * else
			     * If the monster would be referred to as "it" or if the monster has a name
			     * _and_ there is no adjective, "invisible", "saddled", etc., override this
			     * and always use no article.
			     */
	       const char *adjective,
	       int suppress, /* SUPPRESS_IT, SUPPRESS_INVISIBLE, SUPPRESS_HALLUCINATION, SUPPRESS_SADDLE.
	                      * EXACT_NAME: combination of all the above
			      */
	       boolean called)
{
	static char buf[BUFSZ];

	const struct permonst *mdat = mtmp->data;
	boolean do_hallu, do_invis, do_it, do_saddle;
	boolean name_at_start, has_adjectives;
	char *bp;

	if (program_state.gameover)
	    suppress |= SUPPRESS_HALLUCINATION;
	if (article == ARTICLE_YOUR && !mtmp->mtame)
	    article = ARTICLE_THE;

	do_hallu = Hallucination && !(suppress & SUPPRESS_HALLUCINATION);
	do_invis = mtmp->minvis && !(suppress & SUPPRESS_INVISIBLE);
	do_it = !canspotmon(level, mtmp) &&
	    article != ARTICLE_YOUR &&
	    !program_state.gameover &&
	    mtmp != u.usteed &&
	    !(u.uswallow && mtmp == u.ustuck) &&
	    !(suppress & SUPPRESS_IT);
	do_saddle = !(suppress & SUPPRESS_SADDLE);

	buf[0] = 0;

	/* unseen monsters, etc.  Use "it" */
	if (do_it) {
	    strcpy(buf, "it");
	    return buf;
	}

	/* priests and minions: don't even use this function */
	if (mtmp->ispriest || mtmp->isminion) {
	    struct monst *priestmon = newmonst(mtmp->mxtyp, mtmp->mnamelth);
	    char priestnambuf[BUFSZ];
	    char *name;
	    long save_prop = EHalluc_resistance;
	    memcpy(priestmon, mtmp, sizeof(struct monst) + mtmp->mxlth + mtmp->mnamelth);

	    /* when true name is wanted, explicitly block Hallucination */
	    if (!do_hallu) EHalluc_resistance = 1L;
	    if (!do_invis) priestmon->minvis = 0;
	    name = priestname(priestmon, priestnambuf);
	    EHalluc_resistance = save_prop;
	    if (article == ARTICLE_NONE && !strncmp(name, "the ", 4))
		name += 4;
	    strcpy(buf, name);
	    free(priestmon);
	    return buf;
	}

	/* Shopkeepers: use shopkeeper name.  For normal shopkeepers, just
	 * "Asidonhopo"; for unusual ones, "Asidonhopo the invisible
	 * shopkeeper" or "Asidonhopo the blue dragon".  If hallucinating,
	 * none of this applies.
	 */
	if (mtmp->isshk && !do_hallu) {
	    if (adjective && article == ARTICLE_THE) {
		/* pathological case: "the angry Asidonhopo the blue dragon"
		   sounds silly */
		strcpy(buf, "the ");
		strcat(strcat(buf, adjective), " ");
		strcat(buf, shkname(mtmp));
		return buf;
	    }
	    strcat(buf, shkname(mtmp));
	    if (mdat == &mons[PM_SHOPKEEPER] && !do_invis)
		return buf;
	    strcat(buf, " the ");
	    if (do_invis)
		strcat(buf, "invisible ");
	    strcat(buf, mons_mname(mdat));
	    return buf;
	}

	/* Put the adjectives in the buffer */
	if (adjective)
	    strcat(strcat(buf, adjective), " ");
	if (do_invis)
	    strcat(buf, "invisible ");

	if (do_saddle && (mtmp->misc_worn_check & W_SADDLE) &&
	    !Blind && !Hallucination)
	    strcat(buf, "saddled ");

	if (buf[0] != 0)
	    has_adjectives = TRUE;
	else
	    has_adjectives = FALSE;

	/* Put the actual monster name or type into the buffer now */
	/* Be sure to remember whether the buffer starts with a name */
	if (do_hallu) {
	    strcat(buf, rndmonnam());
	    name_at_start = FALSE;
	} else if (mtmp->mnamelth) {
	    char *name = NAME(mtmp);

	    if (mdat == &mons[PM_GHOST]) {
		sprintf(eos(buf), "%s ghost", s_suffix(name));
		name_at_start = TRUE;
	    } else if (called) {
		sprintf(eos(buf), "%s called %s", mons_mname(mdat), name);
		name_at_start = (boolean)type_is_pname(mdat);
	    } else if (is_mplayer(mdat) && (bp = strstri(name, " the ")) != 0) {
		/* <name> the <adjective> <invisible> <saddled> <rank> */
		char pbuf[BUFSZ];

		strcpy(pbuf, name);
		pbuf[bp - name + 5] = '\0'; /* adjectives right after " the " */
		if (has_adjectives)
		    strcat(pbuf, buf);
		strcat(pbuf, bp + 5);	/* append the rest of the name */
		strcpy(buf, pbuf);
		article = ARTICLE_NONE;
		name_at_start = TRUE;
	    } else {
		strcat(buf, name);
		name_at_start = TRUE;
	    }
	} else if (is_mplayer(mdat) && !In_endgame(&u.uz)) {
	    char pbuf[BUFSZ];
	    strcpy(pbuf, rank_of((int)mtmp->m_lev,
				 monsndx(mdat), (boolean)mtmp->female));
	    strcat(buf, lcase(pbuf));
	    name_at_start = FALSE;
	} else if (is_rider(mtmp->data) &&
		   distu(mtmp->mx, mtmp->my) > 2 &&
		   !canseemon(level, mtmp) &&
		   /* for livelog reporting */
		   !(suppress & SUPPRESS_IT)) {
	    /* prevent the three horsemen from being identified from afar */
	    strcat(buf, "Rider");
	    name_at_start = FALSE;
	} else {
	    strcat(buf, mons_mname(mdat));
	    name_at_start = (boolean)type_is_pname(mdat);
	}

	if (name_at_start && (article == ARTICLE_YOUR || !has_adjectives)) {
	    if (mdat == &mons[PM_WIZARD_OF_YENDOR])
		article = ARTICLE_THE;
	    else
		article = ARTICLE_NONE;
	} else if ((mdat->geno & G_UNIQ) && article == ARTICLE_A) {
	    article = ARTICLE_THE;
	}

	{
	    char buf2[BUFSZ];

	    switch(article) {
		case ARTICLE_YOUR:
		    strcpy(buf2, "your ");
		    strcat(buf2, buf);
		    strcpy(buf, buf2);
		    return buf;
		case ARTICLE_THE:
		    strcpy(buf2, "the ");
		    strcat(buf2, buf);
		    strcpy(buf, buf2);
		    return buf;
		case ARTICLE_A:
		    return an(buf);
		case ARTICLE_NONE:
		default:
		    return buf;
	    }
	}
}